

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

bool duckdb::VectorCastHelpers::
     TemplatedDecimalCast<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::TryCastToDecimal>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  VectorDecimalCastData input;
  Vector *local_28;
  CastParameters *local_20;
  undefined1 local_18;
  uint8_t local_10;
  uint8_t local_f;
  
  local_18 = 1;
  local_28 = result;
  local_20 = parameters;
  local_10 = width;
  local_f = scale;
  UnaryExecutor::
  GenericExecute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
            (source,result,count,&local_28,parameters->error_message != (string *)0x0);
  return (bool)local_18;
}

Assistant:

static bool TemplatedDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters,
	                                 uint8_t width, uint8_t scale) {
		VectorDecimalCastData input(result, parameters, width, scale);
		UnaryExecutor::GenericExecute<SRC, T, VectorDecimalCastOperator<OP>>(source, result, count, (void *)&input,
		                                                                     parameters.error_message);
		return input.vector_cast_data.all_converted;
	}